

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::init
          (GeometryShaderRenderTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  int extraout_EAX;
  Surface *pSVar2;
  ReferenceContextBuffers *this_00;
  RenderTarget *pRVar3;
  RenderTarget *pRVar4;
  ReferenceContext *this_01;
  GLContext *this_02;
  NotSupportedError *this_03;
  MultisamplePixelBufferAccess local_f0;
  MultisamplePixelBufferAccess local_c8;
  MultisamplePixelBufferAccess local_a0;
  ReferenceContextLimits local_78;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar1) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x753);
      __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_78.extensionStr._M_dataplus._M_p = (pointer)&local_78.extensionStr.field_2;
  local_78.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_78.maxTextureImageUnits = 0x10;
  local_78.maxTexture2DSize = 0x800;
  local_78.maxTextureCubeSize = 0x800;
  local_78.maxTexture2DArrayLayers = 0x100;
  local_78.maxTexture3DSize = 0x100;
  local_78.maxRenderbufferSize = 0x800;
  local_78.maxVertexAttribs = 0x10;
  local_78.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.extensionStr._M_string_length = 0;
  local_78.extensionStr.field_2._M_local_buf[0] = '\0';
  pSVar2 = (Surface *)operator_new(0x18);
  tcu::Surface::Surface(pSVar2,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
  this->m_glResult = pSVar2;
  pSVar2 = (Surface *)operator_new(0x18);
  tcu::Surface::Surface(pSVar2,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
  this->m_refResult = pSVar2;
  this_00 = (ReferenceContextBuffers *)operator_new(0x78);
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_00,&pRVar3->m_pixelFormat,pRVar4->m_depthBits,0,(this->m_viewportSize).m_data[0],
             (this->m_viewportSize).m_data[1],1);
  this->m_refBuffers = this_00;
  this_01 = (ReferenceContext *)operator_new(0x61b0);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_f0,this_00);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_a0,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_c8,this->m_refBuffers);
  sglr::ReferenceContext::ReferenceContext(this_01,&local_78,&local_f0,&local_a0,&local_c8);
  this->m_refContext = this_01;
  this_02 = (GLContext *)operator_new(0x170);
  local_f0.m_access.super_ConstPixelBufferAccess.m_format.order = R;
  local_f0.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_f0.m_access.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
       *(undefined8 *)(this->m_viewportSize).m_data;
  sglr::GLContext::GLContext
            (this_02,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&local_f0);
  this->m_glContext = (Context *)this_02;
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_78);
  return extraout_EAX;
}

Assistant:

void GeometryShaderRenderTest::init (void)
{
	// requirements
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// gen resources
	{
		sglr::ReferenceContextLimits limits;

		m_glResult		= new tcu::Surface(m_viewportSize.x(), m_viewportSize.y());
		m_refResult		= new tcu::Surface(m_viewportSize.x(), m_viewportSize.y());

		m_refBuffers	= new sglr::ReferenceContextBuffers(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, m_viewportSize.x(), m_viewportSize.y());
		m_refContext	= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());
		m_glContext		= new sglr::GLContext(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, m_viewportSize.x(), m_viewportSize.y()));
	}
}